

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

Own<capnp::ClientHook,_std::nullptr_t> __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::bootstrap(RpcConnectionState *this)

{
  SourceLocation location;
  bool bVar1;
  uint uVar2;
  Exception *t;
  Own<kj::PromiseFulfiller<kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>_>,_std::nullptr_t>
  *params_2;
  RefOrVoid<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef> pQVar3;
  Connected *pCVar4;
  Connection *pCVar5;
  OutgoingRpcMessage *pOVar6;
  Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t> *params_1;
  Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>
  *params_2_00;
  RpcPipeline *pRVar7;
  ClientHook *extraout_RDX;
  ClientHook *extraout_RDX_00;
  ClientHook *pCVar8;
  RpcConnectionState *in_RSI;
  Own<capnp::ClientHook,_std::nullptr_t> OVar9;
  ArrayPtr<const_capnp::PipelineOp> ops;
  undefined8 in_stack_fffffffffffffca0;
  Array<const_capnp::PipelineOp> local_2d0;
  ArrayPtr<const_capnp::PipelineOp> local_2b8;
  undefined1 local_2a8 [8];
  Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcPipeline,_std::nullptr_t> pipeline;
  BuilderFor<capnp::rpc::Message> local_280;
  undefined1 local_258 [8];
  Builder builder;
  Own<capnp::OutgoingRpcMessage,_std::nullptr_t> message;
  Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>
  local_210;
  undefined1 local_208 [8];
  Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t> questionRef;
  SourceLocation local_1f0;
  undefined1 local_1d8 [8];
  PromiseFulfillerPair<kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>_>
  paf;
  Question *question;
  QuestionId questionId;
  Exception local_1a8;
  RpcConnectionState *this_local;
  
  this_local = this;
  bVar1 = kj::OneOf<capnp::_::RpcSystemBase::RpcConnectionState::Connected,_kj::Exception>::
          is<kj::Exception>(&in_RSI->connection);
  if (bVar1) {
    t = kj::OneOf<capnp::_::RpcSystemBase::RpcConnectionState::Connected,_kj::Exception>::
        get<kj::Exception>(&in_RSI->connection);
    kj::cp<kj::Exception>(&local_1a8,t);
    newBrokenCap((capnp *)this,&local_1a8);
    kj::Exception::~Exception(&local_1a8);
    pCVar8 = extraout_RDX;
  }
  else {
    setNotIdle(in_RSI);
    paf.fulfiller.ptr =
         (PromiseFulfiller<kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>_>
          *)anon_unknown_18::
            ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::next
                      (&in_RSI->questions,(uint *)&question);
    ((Question *)paf.fulfiller.ptr)->isAwaitingReturn = true;
    kj::SourceLocation::SourceLocation
              (&local_1f0,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
               ,"bootstrap",0x1ab,0x10);
    location.function = (char *)local_1f0._16_8_;
    location.fileName = local_1f0.function;
    location.lineNumber = (int)in_stack_fffffffffffffca0;
    location.columnNumber = (int)((ulong)in_stack_fffffffffffffca0 >> 0x20);
    kj::
    newPromiseAndFulfiller<kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,decltype(nullptr)>>>
              (location);
    params_2 = kj::
               mv<kj::Own<kj::PromiseFulfiller<kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,decltype(nullptr)>>>,decltype(nullptr)>>
                         ((Own<kj::PromiseFulfiller<kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>_>,_std::nullptr_t>
                           *)&paf);
    kj::
    refcounted<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,capnp::_::RpcSystemBase::RpcConnectionState&,unsigned_int&,kj::Own<kj::PromiseFulfiller<kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,decltype(nullptr)>>>,decltype(nullptr)>>
              ((kj *)local_208,in_RSI,(uint *)&question,params_2);
    pQVar3 = kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t>::
             operator*((Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t>
                        *)local_208);
    kj::Maybe<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef_&>::operator=
              ((Maybe<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef_&> *)
               (paf.fulfiller.ptr + 3),pQVar3);
    pQVar3 = kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t>::
             operator*((Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t>
                        *)local_208);
    kj::addRef<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef>((kj *)&message.ptr,pQVar3);
    kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,decltype(nullptr)>>
    ::attach<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,decltype(nullptr)>>
              ((Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,decltype(nullptr)>>
                *)&local_210,
               (Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t> *)
               local_1d8);
    kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>
    ::operator=((Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>
                 *)local_1d8,&local_210);
    kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>
    ::~Promise(&local_210);
    kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t>::~Own
              ((Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t> *)
               &message.ptr);
    pCVar4 = kj::OneOf<capnp::_::RpcSystemBase::RpcConnectionState::Connected,_kj::Exception>::
             get<capnp::_::RpcSystemBase::RpcConnectionState::Connected>(&in_RSI->connection);
    pCVar5 = kj::Own<capnp::_::VatNetworkBase::Connection,_std::nullptr_t>::operator->
                       (&pCVar4->connection);
    uVar2 = anon_unknown_18::messageSizeHint<capnp::rpc::Bootstrap>();
    (**pCVar5->_vptr_Connection)(&builder._builder.dataSize,pCVar5,(ulong)uVar2);
    pOVar6 = kj::Own<capnp::OutgoingRpcMessage,_std::nullptr_t>::operator->
                       ((Own<capnp::OutgoingRpcMessage,_std::nullptr_t> *)&builder._builder.dataSize
                       );
    (**pOVar6->_vptr_OutgoingRpcMessage)(&pipeline.ptr);
    AnyPointer::Builder::initAs<capnp::rpc::Message>(&local_280,(Builder *)&pipeline.ptr);
    rpc::Message::Builder::initBootstrap((Builder *)local_258,&local_280);
    rpc::Bootstrap::Builder::setQuestionId((Builder *)local_258,(uint32_t)question);
    pOVar6 = kj::Own<capnp::OutgoingRpcMessage,_std::nullptr_t>::operator->
                       ((Own<capnp::OutgoingRpcMessage,_std::nullptr_t> *)&builder._builder.dataSize
                       );
    (*pOVar6->_vptr_OutgoingRpcMessage[2])();
    kj::Own<capnp::OutgoingRpcMessage,_std::nullptr_t>::~Own
              ((Own<capnp::OutgoingRpcMessage,_std::nullptr_t> *)&builder._builder.dataSize);
    params_1 = kj::
               mv<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,decltype(nullptr)>>
                         ((Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t>
                           *)local_208);
    params_2_00 = kj::
                  mv<kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,decltype(nullptr)>>>
                            ((Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>
                              *)local_1d8);
    kj::
    refcounted<capnp::_::RpcSystemBase::RpcConnectionState::RpcPipeline,capnp::_::RpcSystemBase::RpcConnectionState&,kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,decltype(nullptr)>,kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,decltype(nullptr)>>>
              ((kj *)local_2a8,in_RSI,params_1,params_2_00);
    pRVar7 = kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcPipeline,_std::nullptr_t>::
             operator->((Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcPipeline,_std::nullptr_t>
                         *)local_2a8);
    kj::Array<const_capnp::PipelineOp>::Array(&local_2d0,(void *)0x0);
    local_2b8 = kj::Array::operator_cast_to_ArrayPtr((Array *)&local_2d0);
    ops.size_ = (size_t)local_2b8.ptr;
    ops.ptr = (PipelineOp *)pRVar7;
    RpcPipeline::getPipelinedCap((RpcPipeline *)this,ops);
    kj::Array<const_capnp::PipelineOp>::~Array(&local_2d0);
    kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcPipeline,_std::nullptr_t>::~Own
              ((Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcPipeline,_std::nullptr_t> *)
               local_2a8);
    kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t>::~Own
              ((Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t> *)
               local_208);
    kj::
    PromiseFulfillerPair<kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>_>
    ::~PromiseFulfillerPair
              ((PromiseFulfillerPair<kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>_>
                *)local_1d8);
    pCVar8 = extraout_RDX_00;
  }
  OVar9.ptr = pCVar8;
  OVar9.disposer = (Disposer *)this;
  return OVar9;
}

Assistant:

kj::Own<ClientHook> bootstrap() {
    if (connection.is<Disconnected>()) {
      return newBrokenCap(kj::cp(connection.get<Disconnected>()));
    }

    setNotIdle();

    QuestionId questionId;
    auto& question = questions.next(questionId);

    question.isAwaitingReturn = true;

    auto paf = kj::newPromiseAndFulfiller<kj::Promise<kj::Own<RpcResponse>>>();

    auto questionRef = kj::refcounted<QuestionRef>(*this, questionId, kj::mv(paf.fulfiller));
    question.selfRef = *questionRef;

    paf.promise = paf.promise.attach(kj::addRef(*questionRef));

    {
      auto message = connection.get<Connected>().connection->newOutgoingMessage(
          messageSizeHint<rpc::Bootstrap>());

      auto builder = message->getBody().initAs<rpc::Message>().initBootstrap();
      builder.setQuestionId(questionId);
      message->send();
    }

    auto pipeline = kj::refcounted<RpcPipeline>(*this, kj::mv(questionRef), kj::mv(paf.promise));

    return pipeline->getPipelinedCap(kj::Array<const PipelineOp>(nullptr));
  }